

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ColonExpressionClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ColonExpressionClauseSyntax,slang::syntax::ColonExpressionClauseSyntax_const&>
          (BumpAllocator *this,ColonExpressionClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ColonExpressionClauseSyntax *pCVar10;
  
  pCVar10 = (ColonExpressionClauseSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->colon).kind;
  uVar7 = (args->colon).field_0x2;
  NVar8.raw = (args->colon).numFlags.raw;
  uVar9 = (args->colon).rawLen;
  pIVar3 = (args->colon).info;
  pEVar4 = (args->expr).ptr;
  (pCVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pCVar10->super_SyntaxNode).parent = pSVar1;
  (pCVar10->super_SyntaxNode).previewNode = pSVar2;
  (pCVar10->colon).kind = TVar6;
  (pCVar10->colon).field_0x2 = uVar7;
  (pCVar10->colon).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar10->colon).rawLen = uVar9;
  (pCVar10->colon).info = pIVar3;
  (pCVar10->expr).ptr = pEVar4;
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }